

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

void __thiscall HEVCStreamReader::~HEVCStreamReader(HEVCStreamReader *this)

{
  HevcSpsUnit *pHVar1;
  
  operator_delete(this->m_vps,0x50);
  pHVar1 = this->m_sps;
  if (pHVar1 != (HevcSpsUnit *)0x0) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&(pHVar1->num_delta_pocs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  operator_delete(pHVar1,0xa0);
  operator_delete(this->m_pps,0x48);
  operator_delete(this->m_hdr,0x40);
  operator_delete(this->m_slice,0x48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->m_ppsBuffer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->m_spsBuffer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->m_vpsBuffer);
  MPEGStreamReader::~MPEGStreamReader(&this->super_MPEGStreamReader);
  return;
}

Assistant:

HEVCStreamReader::~HEVCStreamReader()
{
    delete m_vps;
    delete m_sps;
    delete m_pps;
    delete m_hdr;
    delete m_slice;
}